

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

arena_t * duckdb_je_arena_choose_hard(tsd_t *tsd,_Bool internal)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  arena_t *paVar5;
  uint ind;
  undefined7 in_register_00000031;
  ulong uVar6;
  long lVar7;
  atomic_p_t aVar8;
  atomic_p_t arena;
  _Bool is_new_arena [2];
  uint choose [2];
  char local_42 [2];
  uint local_40 [2];
  ulong local_38;
  
  ind = duckdb_je_narenas_auto;
  if (duckdb_je_narenas_auto < 2) {
    aVar8.repr = duckdb_je_arenas[0].repr;
    if (duckdb_je_arenas[0].repr == (void *)0x0) {
      aVar8.repr = (arena_t *)0x0;
    }
    arena_bind(tsd,0,false);
    arena = duckdb_je_arenas[0];
    if (duckdb_je_arenas[0].repr == (void *)0x0) {
      arena.repr = (arena_t *)0x0;
    }
    duckdb_je_arena_nthreads_inc((arena_t *)arena.repr,true);
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_iarena = (arena_t *)arena.repr;
  }
  else {
    local_38 = CONCAT44(local_38._4_4_,(int)CONCAT71(in_register_00000031,internal));
    local_40[0] = 0;
    local_40[1] = 0;
    local_42[0] = '\0';
    local_42[1] = '\0';
    iVar1 = pthread_mutex_trylock((pthread_mutex_t *)((long)&duckdb_je_arenas_lock.field_0 + 0x48));
    if (iVar1 != 0) {
      duckdb_je_malloc_mutex_lock_slow(&duckdb_je_arenas_lock);
      duckdb_je_arenas_lock.field_0.field_0.locked.repr = (atomic_b_t)true;
    }
    duckdb_je_arenas_lock.field_0.field_0.prof_data.n_lock_ops =
         duckdb_je_arenas_lock.field_0.field_0.prof_data.n_lock_ops + 1;
    if (&(duckdb_je_arenas_lock.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
      duckdb_je_arenas_lock.field_0.witness.link.qre_prev =
           (witness_t *)(duckdb_je_arenas_lock.field_0.field_0.prof_data.n_owner_switches + 1);
      duckdb_je_arenas_lock.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
    }
    if (1 < duckdb_je_narenas_auto) {
      uVar6 = 1;
      do {
        pvVar4 = duckdb_je_arenas[uVar6].repr;
        if (pvVar4 == (void *)0x0) {
          pvVar4 = (void *)0x0;
        }
        if (pvVar4 == (void *)0x0) {
          if (ind == duckdb_je_narenas_auto) {
            ind = (uint)uVar6;
          }
        }
        else {
          lVar7 = 0;
          do {
            paVar5 = (arena_t *)duckdb_je_arenas[uVar6].repr;
            if (paVar5 == (arena_t *)0x0) {
              paVar5 = (arena_t *)0x0;
            }
            uVar2 = duckdb_je_arena_nthreads_get(paVar5,lVar7 != 0);
            paVar5 = (arena_t *)duckdb_je_arenas[local_40[lVar7]].repr;
            if (paVar5 == (arena_t *)0x0) {
              paVar5 = (arena_t *)0x0;
            }
            uVar3 = duckdb_je_arena_nthreads_get(paVar5,lVar7 != 0);
            if (uVar2 < uVar3) {
              local_40[lVar7] = (uint)uVar6;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < duckdb_je_narenas_auto);
    }
    local_38 = local_38 & 0xff;
    uVar6 = 0;
    aVar8.repr = (arena_t *)0x0;
    do {
      paVar5 = (arena_t *)duckdb_je_arenas[local_40[uVar6]].repr;
      if (paVar5 == (arena_t *)0x0) {
        paVar5 = (arena_t *)0x0;
      }
      uVar2 = duckdb_je_arena_nthreads_get(paVar5,uVar6 != 0);
      if ((uVar2 == 0) || (ind == duckdb_je_narenas_auto)) {
        if ((local_38 == uVar6) &&
           (aVar8.repr = duckdb_je_arenas[local_40[uVar6]].repr,
           (arena_t *)aVar8.repr == (arena_t *)0x0)) {
          aVar8.repr = (arena_t *)0x0;
        }
      }
      else {
        local_40[uVar6] = ind;
        paVar5 = arena_init_locked((tsdn_t *)tsd,ind,&duckdb_je_arena_config_default);
        if (paVar5 == (arena_t *)0x0) {
          duckdb_je_arenas_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
          pthread_mutex_unlock((pthread_mutex_t *)((long)&duckdb_je_arenas_lock.field_0 + 0x48));
        }
        else {
          local_42[uVar6] = '\x01';
          if (local_38 == uVar6) {
            aVar8.repr = paVar5;
          }
        }
        if (paVar5 == (arena_t *)0x0) {
          return (arena_t *)0x0;
        }
      }
      arena_bind(tsd,local_40[uVar6],uVar6 != 0);
      uVar6 = uVar6 + 1;
    } while (uVar6 == 1);
    duckdb_je_arenas_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&duckdb_je_arenas_lock.field_0 + 0x48));
    lVar7 = 0;
    do {
      if (local_42[lVar7] == '\x01') {
        arena_new_create_background_thread((tsdn_t *)tsd,local_40[lVar7]);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
  }
  return (arena_t *)aVar8.repr;
}

Assistant:

arena_t *
arena_choose_hard(tsd_t *tsd, bool internal) {
	arena_t *ret JEMALLOC_CC_SILENCE_INIT(NULL);

	if (have_percpu_arena && PERCPU_ARENA_ENABLED(opt_percpu_arena)) {
		unsigned choose = percpu_arena_choose();
		ret = arena_get(tsd_tsdn(tsd), choose, true);
		assert(ret != NULL);
		arena_bind(tsd, arena_ind_get(ret), false);
		arena_bind(tsd, arena_ind_get(ret), true);

		return ret;
	}

	if (narenas_auto > 1) {
		unsigned i, j, choose[2], first_null;
		bool is_new_arena[2];

		/*
		 * Determine binding for both non-internal and internal
		 * allocation.
		 *
		 *   choose[0]: For application allocation.
		 *   choose[1]: For internal metadata allocation.
		 */

		for (j = 0; j < 2; j++) {
			choose[j] = 0;
			is_new_arena[j] = false;
		}

		first_null = narenas_auto;
		malloc_mutex_lock(tsd_tsdn(tsd), &arenas_lock);
		assert(arena_get(tsd_tsdn(tsd), 0, false) != NULL);
		for (i = 1; i < narenas_auto; i++) {
			if (arena_get(tsd_tsdn(tsd), i, false) != NULL) {
				/*
				 * Choose the first arena that has the lowest
				 * number of threads assigned to it.
				 */
				for (j = 0; j < 2; j++) {
					if (arena_nthreads_get(arena_get(
					    tsd_tsdn(tsd), i, false), !!j) <
					    arena_nthreads_get(arena_get(
					    tsd_tsdn(tsd), choose[j], false),
					    !!j)) {
						choose[j] = i;
					}
				}
			} else if (first_null == narenas_auto) {
				/*
				 * Record the index of the first uninitialized
				 * arena, in case all extant arenas are in use.
				 *
				 * NB: It is possible for there to be
				 * discontinuities in terms of initialized
				 * versus uninitialized arenas, due to the
				 * "thread.arena" mallctl.
				 */
				first_null = i;
			}
		}

		for (j = 0; j < 2; j++) {
			if (arena_nthreads_get(arena_get(tsd_tsdn(tsd),
			    choose[j], false), !!j) == 0 || first_null ==
			    narenas_auto) {
				/*
				 * Use an unloaded arena, or the least loaded
				 * arena if all arenas are already initialized.
				 */
				if (!!j == internal) {
					ret = arena_get(tsd_tsdn(tsd),
					    choose[j], false);
				}
			} else {
				arena_t *arena;

				/* Initialize a new arena. */
				choose[j] = first_null;
				arena = arena_init_locked(tsd_tsdn(tsd),
				    choose[j], &arena_config_default);
				if (arena == NULL) {
					malloc_mutex_unlock(tsd_tsdn(tsd),
					    &arenas_lock);
					return NULL;
				}
				is_new_arena[j] = true;
				if (!!j == internal) {
					ret = arena;
				}
			}
			arena_bind(tsd, choose[j], !!j);
		}
		malloc_mutex_unlock(tsd_tsdn(tsd), &arenas_lock);

		for (j = 0; j < 2; j++) {
			if (is_new_arena[j]) {
				assert(choose[j] > 0);
				arena_new_create_background_thread(
				    tsd_tsdn(tsd), choose[j]);
			}
		}

	} else {
		ret = arena_get(tsd_tsdn(tsd), 0, false);
		arena_bind(tsd, 0, false);
		arena_bind(tsd, 0, true);
	}

	return ret;
}